

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_AND(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  int rc;
  Fts5ExprNode *unaff_retaddr;
  undefined4 local_24;
  
  local_24 = (**(code **)(*(long *)(in_RSI + 0x30) + 0x10))
                       (in_RDI,*(undefined8 *)(in_RSI + 0x30),in_EDX,in_RCX);
  if (local_24 == 0) {
    local_24 = fts5ExprNodeTest_AND((Fts5Expr *)iFrom,unaff_retaddr);
  }
  else {
    *(undefined4 *)(in_RSI + 8) = 0;
  }
  return local_24;
}

Assistant:

static int fts5ExprNodeNext_AND(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc = fts5ExprNodeNext(pExpr, pNode->apChild[0], bFromValid, iFrom);
  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest_AND(pExpr, pNode);
  }else{
    pNode->bNomatch = 0;
  }
  return rc;
}